

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

StatementSyntax * __thiscall
slang::parsing::Parser::parseStatement(Parser *this,bool allowEmpty,bool allowSuperNew)

{
  Token colon;
  Token name_00;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  Token semicolon;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_00;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_01;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_02;
  Token semicolon_00;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_03;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_04;
  Token semicolon_01;
  Token foreverKeyword;
  Token semi;
  string_view syntaxName;
  string_view arg;
  Token prevToken;
  AttrList attributes_00;
  AttrList attributes_01;
  AttrList attributes_02;
  AttrList attributes_03;
  AttrList attributes_04;
  AttrList attributes_05;
  AttrList attributes_06;
  AttrList attributes_07;
  AttrList attributes_08;
  AttrList attributes_09;
  AttrList attributes_10;
  AttrList attributes_11;
  AttrList attributes_12;
  AttrList attributes_13;
  AttrList attributes_14;
  Token uniqueOrPriority;
  Token uniqueOrPriority_00;
  AttrList attributes_15;
  AttrList attributes_16;
  AttrList attributes_17;
  AttrList attributes_18;
  AttrList attributes_19;
  AttrList attributes_20;
  AttrList attributes_21;
  AttrList attributes_22;
  Token uniqueOrPriority_01;
  Token uniqueOrPriority_02;
  AttrList attributes_23;
  AttrList attributes_24;
  Token caseKeyword;
  Token caseKeyword_00;
  AttrList attributes_25;
  Token TVar1;
  Token TVar2;
  Token TVar3;
  Token TVar4;
  Token TVar5;
  Token TVar6;
  Token TVar7;
  byte bVar8;
  ParserBase *this_00;
  byte bVar10;
  byte in_DL;
  byte in_SIL;
  bool bVar11;
  AttrList AVar12;
  Token TVar13;
  Token TVar14;
  Token TVar15;
  ExpressionSyntax *expr;
  bitmask<slang::parsing::detail::ExpressionOptions> options;
  uint32_t index;
  TimingControlSyntax *timingControl;
  StatementSyntax *body;
  Token forever;
  Token modifier;
  AttrList attributes;
  Token name;
  NamedLabelSyntax *label;
  DepthGuard dg;
  Parser *in_stack_fffffffffffff4a8;
  undefined4 in_stack_fffffffffffff4b0;
  TokenKind in_stack_fffffffffffff4b4;
  TokenKind in_stack_fffffffffffff4b6;
  ParserBase *in_stack_fffffffffffff4b8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff4c0;
  undefined8 in_stack_fffffffffffff4c8;
  ParserBase *in_stack_fffffffffffff4d0;
  SyntaxNode *in_stack_fffffffffffff4d8;
  Parser *in_stack_fffffffffffff4e0;
  size_t in_stack_fffffffffffff4e8;
  Diagnostic *in_stack_fffffffffffff4f0;
  size_t in_stack_fffffffffffff4f8;
  Info *in_stack_fffffffffffff500;
  ParserBase *in_stack_fffffffffffff510;
  SourceLocation in_stack_fffffffffffff518;
  Parser *in_stack_fffffffffffff520;
  DiagCode DVar16;
  pointer in_stack_fffffffffffff528;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff530;
  NamedLabelSyntax *in_stack_fffffffffffff538;
  Parser *in_stack_fffffffffffff540;
  undefined7 in_stack_fffffffffffff548;
  undefined1 in_stack_fffffffffffff54f;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff550;
  NamedLabelSyntax *in_stack_fffffffffffff558;
  Parser *in_stack_fffffffffffff560;
  Info *in_stack_fffffffffffff568;
  undefined4 in_stack_fffffffffffff570;
  SyntaxKind in_stack_fffffffffffff574;
  ParserBase *in_stack_fffffffffffff578;
  Parser *in_stack_fffffffffffff580;
  SyntaxKind kind;
  NamedLabelSyntax *in_stack_fffffffffffff588;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff590;
  undefined7 in_stack_fffffffffffff598;
  undefined1 in_stack_fffffffffffff59f;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff5a0;
  pointer in_stack_fffffffffffff5a8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff5b0;
  NamedLabelSyntax *in_stack_fffffffffffff5c0;
  undefined7 in_stack_fffffffffffff5c8;
  undefined1 in_stack_fffffffffffff5cf;
  pointer in_stack_fffffffffffff5d0;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff5d8;
  TokenKind endKind;
  undefined8 in_stack_fffffffffffff5e0;
  SyntaxKind blockKind;
  Parser *in_stack_fffffffffffff5e8;
  undefined7 in_stack_fffffffffffff5f0;
  undefined1 in_stack_fffffffffffff5f7;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff5f8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff600;
  Parser *in_stack_fffffffffffff608;
  pointer in_stack_fffffffffffff610;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff618;
  NamedLabelSyntax *in_stack_fffffffffffff620;
  Parser *in_stack_fffffffffffff628;
  undefined8 in_stack_fffffffffffff630;
  NamedLabelSyntax *in_stack_fffffffffffff638;
  Parser *in_stack_fffffffffffff640;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff648;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff650;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff658;
  NamedLabelSyntax *in_stack_fffffffffffff688;
  Parser *in_stack_fffffffffffff690;
  pointer in_stack_fffffffffffff698;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff6a0;
  Parser *in_stack_fffffffffffff6e0;
  NamedLabelSyntax *in_stack_fffffffffffff6f0;
  Parser *in_stack_fffffffffffff6f8;
  pointer in_stack_fffffffffffff700;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff708;
  Parser *in_stack_fffffffffffff710;
  pointer in_stack_fffffffffffff718;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff720;
  undefined8 in_stack_fffffffffffff758;
  int precedence;
  Parser *in_stack_fffffffffffff760;
  undefined8 in_stack_fffffffffffff768;
  bitmask<slang::parsing::detail::ExpressionOptions> options_00;
  NamedLabelSyntax *in_stack_fffffffffffff788;
  Parser *in_stack_fffffffffffff790;
  pointer in_stack_fffffffffffff798;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff7a0;
  undefined8 in_stack_fffffffffffff7b0;
  undefined1 inAssertion;
  Parser *in_stack_fffffffffffff7b8;
  NamedLabelSyntax *in_stack_fffffffffffff7c8;
  Parser *in_stack_fffffffffffff7d0;
  undefined8 in_stack_fffffffffffff7d8;
  Info *in_stack_fffffffffffff7e0;
  pointer in_stack_fffffffffffff7e8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff7f0;
  undefined8 in_stack_fffffffffffff800;
  Info *in_stack_fffffffffffff808;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff8b0;
  Token local_6f0;
  SourceLocation local_6e0;
  Token local_6d8;
  AttrList local_6c8;
  Token local_678;
  SourceLocation local_668;
  undefined4 local_65c;
  Token local_658;
  AttrList local_648;
  underlying_type local_5fc;
  ParserBase *local_5f8;
  bitmask<slang::parsing::detail::ExpressionOptions> local_5f0;
  bitmask<slang::parsing::detail::ExpressionOptions> local_5ec;
  Token local_5e8;
  AttrList local_5d8;
  undefined8 local_5c8;
  Info *local_5c0;
  Token local_5b8;
  Token local_5a8;
  Token local_598;
  AttrList local_588;
  undefined8 local_570;
  Info *local_568;
  Token local_560;
  Token local_550;
  Token local_540;
  undefined4 local_52c;
  AttrList local_528;
  AttrList local_518;
  Token local_508;
  AttrList local_4f8;
  Token local_4a8;
  SourceLocation local_498;
  undefined4 local_48c;
  Token local_488;
  SourceLocation local_478;
  undefined4 local_46c;
  AttrList local_468;
  AttrList local_458;
  AttrList local_448;
  AttrList local_438;
  AttrList local_428;
  AttrList local_418;
  AttrList local_408;
  AttrList local_3f8;
  AttrList local_3e8;
  AttrList local_3d8;
  AttrList local_3c8;
  AttrList local_3b8;
  AttrList local_3a8;
  AttrList local_398;
  TimingControlSyntax *local_350;
  AttrList local_348;
  AttrList local_338;
  AttrList local_328;
  AttrList local_318;
  AttrList local_308;
  AttrList local_2f8;
  Token local_2e8;
  AttrList local_2d8;
  basic_string_view<char,_std::char_traits<char>_> local_288;
  Token local_278;
  StatementSyntax *local_260;
  Token local_258;
  AttrList local_238;
  Token local_228;
  AttrList local_208;
  Token local_1f0;
  SourceLocation local_1e0;
  Token local_1d8;
  AttrList local_1c8;
  _Storage<slang::DiagCode,_true> local_178;
  undefined2 local_174;
  _Storage<slang::DiagCode,_true> local_16e;
  undefined2 local_16a;
  Token local_168;
  string_view local_158;
  Token local_148;
  SourceLocation local_138;
  undefined4 local_12c;
  Token local_128;
  Token local_118;
  AttrList local_108;
  Token local_f0;
  undefined4 local_dc;
  Token local_d8;
  AttrList local_c8;
  Token local_b8;
  Token local_a8;
  AttrList local_98;
  Token local_88;
  Token local_78;
  Token local_68;
  Token local_58;
  Token local_38;
  NamedLabelSyntax *local_28;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  undefined6 in_stack_ffffffffffffffe8;
  ForLoopStatementSyntax *local_8;
  NamedLabelSyntax *pNVar9;
  
  options_00.m_bits = (underlying_type)((ulong)in_stack_fffffffffffff768 >> 0x20);
  precedence = (int)((ulong)in_stack_fffffffffffff758 >> 0x20);
  inAssertion = (undefined1)((ulong)in_stack_fffffffffffff7b0 >> 0x38);
  bVar10 = in_SIL & 1;
  bVar8 = in_DL & 1;
  setDepthGuard(in_stack_fffffffffffff4a8);
  local_28 = (NamedLabelSyntax *)0x0;
  local_38 = ParserBase::peek(&in_stack_fffffffffffff4a8->super_ParserBase);
  bVar11 = false;
  if (local_38.kind == Identifier) {
    local_58 = ParserBase::peek(in_stack_fffffffffffff4b8,
                                CONCAT22(in_stack_fffffffffffff4b6,in_stack_fffffffffffff4b4));
    bVar11 = local_58.kind == Colon;
  }
  if (bVar11) {
    local_78 = ParserBase::consume(in_stack_fffffffffffff4d0);
    local_68 = local_78;
    local_88 = ParserBase::consume(in_stack_fffffffffffff4d0);
    name_00.info = (Info *)in_stack_fffffffffffff4c0._M_extent_value;
    name_00._0_8_ = in_stack_fffffffffffff4b8;
    colon.info._0_4_ = in_stack_fffffffffffff4b0;
    colon._0_8_ = in_stack_fffffffffffff4a8;
    colon.info._4_2_ = in_stack_fffffffffffff4b4;
    colon.info._6_2_ = in_stack_fffffffffffff4b6;
    in_stack_fffffffffffff8b0._M_extent_value =
         (size_t)slang::syntax::SyntaxFactory::namedLabel((SyntaxFactory *)0x6ed3e6,name_00,colon);
    local_28 = (NamedLabelSyntax *)in_stack_fffffffffffff8b0._M_extent_value;
  }
  AVar12 = parseAttributes(in_stack_fffffffffffff6e0);
  local_98 = AVar12;
  TVar13 = ParserBase::peek(&in_stack_fffffffffffff4a8->super_ParserBase);
  TVar7.info = local_598.info;
  TVar7.kind = local_598.kind;
  TVar7._2_1_ = local_598._2_1_;
  TVar7.numFlags.raw = local_598.numFlags.raw;
  TVar7.rawLen = local_598.rawLen;
  TVar6.info = local_5a8.info;
  TVar6.kind = local_5a8.kind;
  TVar6._2_1_ = local_5a8._2_1_;
  TVar6.numFlags.raw = local_5a8.numFlags.raw;
  TVar6.rawLen = local_5a8.rawLen;
  TVar2.info = local_5b8.info;
  TVar2.kind = local_5b8.kind;
  TVar2._2_1_ = local_5b8._2_1_;
  TVar2.numFlags.raw = local_5b8.numFlags.raw;
  TVar2.rawLen = local_5b8.rawLen;
  TVar5.info = local_540.info;
  TVar5.kind = local_540.kind;
  TVar5._2_1_ = local_540._2_1_;
  TVar5.numFlags.raw = local_540.numFlags.raw;
  TVar5.rawLen = local_540.rawLen;
  TVar4.info = local_550.info;
  TVar4.kind = local_550.kind;
  TVar4._2_1_ = local_550._2_1_;
  TVar4.numFlags.raw = local_550.numFlags.raw;
  TVar4.rawLen = local_550.rawLen;
  TVar3.info = local_560.info;
  TVar3.kind = local_560.kind;
  TVar3._2_1_ = local_560._2_1_;
  TVar3.numFlags.raw = local_560.numFlags.raw;
  TVar3.rawLen = local_560.rawLen;
  TVar15.info = in_stack_fffffffffffff568;
  TVar15.kind = (TokenKind)local_5c8;
  TVar15._2_1_ = local_5c8._2_1_;
  TVar15.numFlags.raw = local_5c8._3_1_;
  TVar15.rawLen = local_5c8._4_4_;
  TVar1.info = local_4a8.info;
  TVar1.kind = local_4a8.kind;
  TVar1._2_1_ = local_4a8._2_1_;
  TVar1.numFlags.raw = local_4a8.numFlags.raw;
  TVar1.rawLen = local_4a8.rawLen;
  TVar14.info = local_568;
  TVar14._0_8_ = in_stack_fffffffffffff5c0;
  local_a8.info = TVar13.info;
  pNVar9 = TVar13._0_8_;
  local_a8._0_4_ = TVar13._0_4_;
  kind = (SyntaxKind)((ulong)in_stack_fffffffffffff580 >> 0x20);
  endKind = (TokenKind)((ulong)in_stack_fffffffffffff5e0 >> 0x10);
  blockKind = (SyntaxKind)((ulong)in_stack_fffffffffffff5e0 >> 0x20);
  local_a8._0_8_ = pNVar9;
  local_a8 = TVar13;
  switch(local_a8._0_4_ - 2 & 0xffff) {
  case 0:
    local_52c = 1;
    local_540 = ParserBase::peek(in_stack_fffffffffffff4b8,
                                 CONCAT22(in_stack_fffffffffffff4b6,in_stack_fffffffffffff4b4));
    bVar11 = false;
    if (local_540.kind == DoubleColon) {
      local_550 = ParserBase::peek(in_stack_fffffffffffff4b8,
                                   CONCAT22(in_stack_fffffffffffff4b6,in_stack_fffffffffffff4b4));
      bVar11 = local_550.kind == Identifier;
    }
    if (bVar11) {
      local_52c = 3;
    }
    local_560 = ParserBase::peek(in_stack_fffffffffffff4b8,
                                 CONCAT22(in_stack_fffffffffffff4b6,in_stack_fffffffffffff4b4));
    TVar14.info = local_568;
    TVar14._0_8_ = in_stack_fffffffffffff5c0;
    bVar11 = false;
    if (local_560.kind == Identifier) {
      TVar14 = ParserBase::peek(in_stack_fffffffffffff4b8,
                                CONCAT22(in_stack_fffffffffffff4b6,in_stack_fffffffffffff4b4));
      local_570._0_2_ = TVar14.kind;
      bVar11 = (TokenKind)local_570 == OpenParenthesis;
      local_570 = TVar14._0_8_;
    }
    TVar7.info = local_598.info;
    TVar7.kind = local_598.kind;
    TVar7._2_1_ = local_598._2_1_;
    TVar7.numFlags.raw = local_598.numFlags.raw;
    TVar7.rawLen = local_598.rawLen;
    TVar6.info = local_5a8.info;
    TVar6.kind = local_5a8.kind;
    TVar6._2_1_ = local_5a8._2_1_;
    TVar6.numFlags.raw = local_5a8.numFlags.raw;
    TVar6.rawLen = local_5a8.rawLen;
    TVar2.info = local_5b8.info;
    TVar2.kind = local_5b8.kind;
    TVar2._2_1_ = local_5b8._2_1_;
    TVar2.numFlags.raw = local_5b8.numFlags.raw;
    TVar2.rawLen = local_5b8.rawLen;
    TVar15.info = in_stack_fffffffffffff568;
    TVar15.kind = (TokenKind)local_5c8;
    TVar15._2_1_ = local_5c8._2_1_;
    TVar15.numFlags.raw = local_5c8._3_1_;
    TVar15.rawLen = local_5c8._4_4_;
    TVar13.info = local_a8.info;
    TVar13._0_8_ = pNVar9;
    local_568 = TVar14.info;
    TVar3 = local_560;
    TVar4 = local_550;
    TVar5 = local_540;
    if (bVar11) {
      attributes_00._M_extent._M_extent_value = in_stack_fffffffffffff530._M_extent_value;
      attributes_00._M_ptr = in_stack_fffffffffffff528;
      local_588 = local_98;
      local_8 = (ForLoopStatementSyntax *)
                parseCheckerStatement
                          (in_stack_fffffffffffff520,(NamedLabelSyntax *)in_stack_fffffffffffff518,
                           attributes_00);
      break;
    }
    goto LAB_006eec32;
  default:
    goto LAB_006eec32;
  case 0x11:
    if (local_28 == (NamedLabelSyntax *)0x0) {
      local_4a8 = TVar1;
      if ((bVar10 & 1) == 0) {
        local_48c = 0x510005;
        local_4a8 = ParserBase::peek(&in_stack_fffffffffffff4a8->super_ParserBase);
        DVar16 = SUB84((ulong)in_stack_fffffffffffff520 >> 0x20,0);
        local_498 = Token::location(&local_4a8);
        ParserBase::addDiag(in_stack_fffffffffffff510,DVar16,in_stack_fffffffffffff518);
        TVar13.info = local_a8.info;
        TVar13._0_8_ = pNVar9;
      }
    }
    else {
      local_46c = 0x860005;
      local_488 = ParserBase::peek(&in_stack_fffffffffffff4a8->super_ParserBase);
      DVar16 = SUB84((ulong)in_stack_fffffffffffff520 >> 0x20,0);
      local_478 = Token::location(&local_488);
      ParserBase::addDiag(in_stack_fffffffffffff510,DVar16,in_stack_fffffffffffff518);
      TVar13.info = local_a8.info;
      TVar13._0_8_ = pNVar9;
    }
    local_a8.info = TVar13.info;
    elements_02._M_extent._M_extent_value = in_stack_fffffffffffff4c0._M_extent_value;
    elements_02._M_ptr = (pointer)in_stack_fffffffffffff4b8;
    local_4f8 = local_98;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
               CONCAT26(in_stack_fffffffffffff4b6,
                        CONCAT24(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0)),elements_02);
    local_508 = ParserBase::consume(in_stack_fffffffffffff4d0);
    semicolon_00.info = (Info *)in_stack_fffffffffffff4c0._M_extent_value;
    semicolon_00._0_8_ = in_stack_fffffffffffff4b8;
    local_8 = (ForLoopStatementSyntax *)
              slang::syntax::SyntaxFactory::emptyStatement
                        ((SyntaxFactory *)
                         CONCAT26(in_stack_fffffffffffff4b6,
                                  CONCAT24(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0)),
                         (NamedLabelSyntax *)in_stack_fffffffffffff4a8,
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)0x6ee775,semicolon_00
                        );
    break;
  case 0x24:
  case 0x25:
    attributes_08._M_extent._M_extent_value = in_stack_fffffffffffff5b0._M_extent_value;
    attributes_08._M_ptr = in_stack_fffffffffffff5a8;
    local_518 = local_98;
    local_8 = (ForLoopStatementSyntax *)
              parseEventTriggerStatement
                        ((Parser *)in_stack_fffffffffffff5a0._M_extent_value,
                         (NamedLabelSyntax *)
                         CONCAT17(in_stack_fffffffffffff59f,in_stack_fffffffffffff598),attributes_08
                        );
    break;
  case 0x2c:
  case 0x2d:
  case 0x55:
    local_350 = parseTimingControl(in_stack_fffffffffffff7b8,(bool)inAssertion);
    elements_01._M_extent._M_extent_value = in_stack_fffffffffffff4c0._M_extent_value;
    elements_01._M_ptr = (pointer)in_stack_fffffffffffff4b8;
    local_398 = local_98;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
               CONCAT26(in_stack_fffffffffffff4b6,
                        CONCAT24(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0)),elements_01);
    parseStatement((Parser *)CONCAT17(bVar10,CONCAT16(bVar8,in_stack_ffffffffffffffe8)),
                   (bool)in_stack_ffffffffffffffe7,(bool)in_stack_ffffffffffffffe6);
    local_8 = (ForLoopStatementSyntax *)
              slang::syntax::SyntaxFactory::timingControlStatement
                        ((SyntaxFactory *)in_stack_fffffffffffff4c0._M_extent_value,
                         (NamedLabelSyntax *)in_stack_fffffffffffff4b8,
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                         CONCAT26(in_stack_fffffffffffff4b6,
                                  CONCAT24(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0)),
                         (TimingControlSyntax *)in_stack_fffffffffffff4a8,
                         (StatementSyntax *)0x6ee047);
    break;
  case 0x62:
  case 100:
  case 0x7f:
    attributes_20._M_extent._M_extent_value = in_stack_fffffffffffff708._M_extent_value;
    attributes_20._M_ptr = in_stack_fffffffffffff700;
    local_418 = local_98;
    local_8 = (ForLoopStatementSyntax *)
              parseAssertionStatement
                        (in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0,attributes_20);
    break;
  case 99:
    attributes_06._M_ptr._7_1_ = in_stack_fffffffffffff59f;
    attributes_06._M_ptr._0_7_ = in_stack_fffffffffffff598;
    attributes_06._M_extent._M_extent_value = in_stack_fffffffffffff5a0._M_extent_value;
    local_3a8 = local_98;
    local_8 = (ForLoopStatementSyntax *)
              parseProceduralAssignStatement
                        ((Parser *)in_stack_fffffffffffff590._M_extent_value,
                         in_stack_fffffffffffff588,attributes_06,kind);
    break;
  case 0x67:
    attributes_10._M_ptr._7_1_ = in_stack_fffffffffffff5f7;
    attributes_10._M_ptr._0_7_ = in_stack_fffffffffffff5f0;
    attributes_10._M_extent._M_extent_value = in_stack_fffffffffffff5f8._M_extent_value;
    local_3f8 = local_98;
    local_8 = (ForLoopStatementSyntax *)
              parseBlock(in_stack_fffffffffffff5e8,blockKind,endKind,
                         (NamedLabelSyntax *)in_stack_fffffffffffff5d8._M_extent_value,attributes_10
                        );
    break;
  case 0x6c:
  case 0x7e:
    attributes_03._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffff570;
    attributes_03._M_ptr = (pointer)in_stack_fffffffffffff568;
    attributes_03._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffff574;
    local_348 = local_98;
    local_8 = (ForLoopStatementSyntax *)
              parseJumpStatement(in_stack_fffffffffffff560,in_stack_fffffffffffff558,attributes_03);
    break;
  case 0x71:
  case 0x72:
  case 0x73:
    local_208 = local_98;
    Token::Token((Token *)CONCAT26(in_stack_fffffffffffff4b6,
                                   CONCAT24(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0)));
    local_228 = ParserBase::consume(in_stack_fffffffffffff4d0);
    attributes_24._M_extent._M_extent_value = in_stack_fffffffffffff7f0._M_extent_value;
    attributes_24._M_ptr = in_stack_fffffffffffff7e8;
    uniqueOrPriority_02.info = in_stack_fffffffffffff7e0;
    uniqueOrPriority_02.kind = (short)in_stack_fffffffffffff7d8;
    uniqueOrPriority_02._2_1_ = (char)((ulong)in_stack_fffffffffffff7d8 >> 0x10);
    uniqueOrPriority_02.numFlags.raw = (char)((ulong)in_stack_fffffffffffff7d8 >> 0x18);
    uniqueOrPriority_02.rawLen = (int)((ulong)in_stack_fffffffffffff7d8 >> 0x20);
    caseKeyword_00.info = in_stack_fffffffffffff808;
    caseKeyword_00.kind = (short)in_stack_fffffffffffff800;
    caseKeyword_00._2_1_ = (char)((ulong)in_stack_fffffffffffff800 >> 0x10);
    caseKeyword_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffff800 >> 0x18);
    caseKeyword_00.rawLen = (int)((ulong)in_stack_fffffffffffff800 >> 0x20);
    local_8 = (ForLoopStatementSyntax *)
              parseCaseStatement(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,attributes_24,
                                 uniqueOrPriority_02,caseKeyword_00);
    break;
  case 0x83:
    attributes_04._M_extent._M_extent_value = in_stack_fffffffffffff590._M_extent_value;
    attributes_04._M_ptr = (pointer)in_stack_fffffffffffff588;
    local_3c8 = local_98;
    local_8 = (ForLoopStatementSyntax *)
              parseProceduralDeassignStatement
                        (in_stack_fffffffffffff580,(NamedLabelSyntax *)in_stack_fffffffffffff578,
                         attributes_04,in_stack_fffffffffffff574);
    break;
  case 0x87:
    attributes_14._M_extent._M_extent_value = in_stack_fffffffffffff618._M_extent_value;
    attributes_14._M_ptr = in_stack_fffffffffffff610;
    local_3e8 = local_98;
    local_8 = (ForLoopStatementSyntax *)
              parseDisableStatement
                        (in_stack_fffffffffffff608,
                         (NamedLabelSyntax *)in_stack_fffffffffffff600._M_extent_value,attributes_14
                        );
    break;
  case 0x89:
    attributes_13._M_extent._M_extent_value = in_stack_fffffffffffff618._M_extent_value;
    attributes_13._M_ptr = in_stack_fffffffffffff610;
    local_308 = local_98;
    local_8 = (ForLoopStatementSyntax *)
              parseDoWhileStatement
                        (in_stack_fffffffffffff608,
                         (NamedLabelSyntax *)in_stack_fffffffffffff600._M_extent_value,attributes_13
                        );
    break;
  case 0xa2:
  case 0x103:
    attributes_18._M_extent._M_extent_value = in_stack_fffffffffffff658._M_extent_value;
    attributes_18._M_ptr = (pointer)in_stack_fffffffffffff650._M_extent_value;
    local_428 = local_98;
    local_8 = (ForLoopStatementSyntax *)
              parseConcurrentAssertion
                        ((Parser *)in_stack_fffffffffffff648._M_extent_value,
                         (NamedLabelSyntax *)in_stack_fffffffffffff640,attributes_18);
    break;
  case 0xa8:
    attributes_25._M_extent._M_extent_value = in_stack_fffffffffffff8b0._M_extent_value;
    attributes_25._M_ptr = AVar12._M_ptr;
    local_318 = local_98;
    local_8 = parseForLoopStatement
                        ((Parser *)AVar12._M_extent._M_extent_value._M_extent_value,pNVar9,
                         attributes_25);
    break;
  case 0xa9:
    attributes_07._M_ptr._7_1_ = in_stack_fffffffffffff59f;
    attributes_07._M_ptr._0_7_ = in_stack_fffffffffffff598;
    attributes_07._M_extent._M_extent_value = in_stack_fffffffffffff5a0._M_extent_value;
    local_3b8 = local_98;
    local_8 = (ForLoopStatementSyntax *)
              parseProceduralAssignStatement
                        ((Parser *)in_stack_fffffffffffff590._M_extent_value,
                         in_stack_fffffffffffff588,attributes_07,kind);
    break;
  case 0xaa:
    attributes_01._M_ptr._7_1_ = in_stack_fffffffffffff54f;
    attributes_01._M_ptr._0_7_ = in_stack_fffffffffffff548;
    attributes_01._M_extent._M_extent_value = in_stack_fffffffffffff550._M_extent_value;
    local_328 = local_98;
    local_8 = (ForLoopStatementSyntax *)
              parseForeachLoopStatement
                        (in_stack_fffffffffffff540,in_stack_fffffffffffff538,attributes_01);
    break;
  case 0xab:
    local_258 = ParserBase::consume(in_stack_fffffffffffff4d0);
    local_260 = parseStatement((Parser *)CONCAT17(bVar10,CONCAT16(bVar8,in_stack_ffffffffffffffe8)),
                               (bool)in_stack_ffffffffffffffe7,(bool)in_stack_ffffffffffffffe6);
    local_278 = local_258;
    local_288 = sv((char *)CONCAT26(in_stack_fffffffffffff4b6,
                                    CONCAT24(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0)),
                   (size_t)in_stack_fffffffffffff4a8);
    prevToken.info = in_stack_fffffffffffff500;
    prevToken.kind = (short)in_stack_fffffffffffff4f8;
    prevToken._2_1_ = (char)(in_stack_fffffffffffff4f8 >> 0x10);
    prevToken.numFlags.raw = (char)(in_stack_fffffffffffff4f8 >> 0x18);
    prevToken.rawLen = (int)(in_stack_fffffffffffff4f8 >> 0x20);
    syntaxName._M_str = (char *)in_stack_fffffffffffff4f0;
    syntaxName._M_len = in_stack_fffffffffffff4e8;
    checkEmptyBody(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,prevToken,syntaxName);
    elements_00._M_extent._M_extent_value = in_stack_fffffffffffff4c0._M_extent_value;
    elements_00._M_ptr = (pointer)in_stack_fffffffffffff4b8;
    local_2d8 = local_98;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
               CONCAT26(in_stack_fffffffffffff4b6,
                        CONCAT24(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0)),elements_00);
    foreverKeyword.info = (Info *)in_stack_fffffffffffff4d0;
    foreverKeyword.kind = (short)in_stack_fffffffffffff4c8;
    foreverKeyword._2_1_ = (char)((ulong)in_stack_fffffffffffff4c8 >> 0x10);
    foreverKeyword.numFlags.raw = (char)((ulong)in_stack_fffffffffffff4c8 >> 0x18);
    foreverKeyword.rawLen = (int)((ulong)in_stack_fffffffffffff4c8 >> 0x20);
    local_2e8 = local_258;
    local_8 = (ForLoopStatementSyntax *)
              slang::syntax::SyntaxFactory::foreverStatement
                        ((SyntaxFactory *)in_stack_fffffffffffff4c0._M_extent_value,
                         (NamedLabelSyntax *)in_stack_fffffffffffff4b8,
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                         CONCAT26(in_stack_fffffffffffff4b6,
                                  CONCAT24(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0)),
                         foreverKeyword,(StatementSyntax *)in_stack_fffffffffffff4a8);
    break;
  case 0xac:
    attributes_11._M_ptr._7_1_ = in_stack_fffffffffffff5f7;
    attributes_11._M_ptr._0_7_ = in_stack_fffffffffffff5f0;
    attributes_11._M_extent._M_extent_value = in_stack_fffffffffffff5f8._M_extent_value;
    local_408 = local_98;
    local_8 = (ForLoopStatementSyntax *)
              parseBlock(in_stack_fffffffffffff5e8,blockKind,endKind,
                         (NamedLabelSyntax *)in_stack_fffffffffffff5d8._M_extent_value,attributes_11
                        );
    break;
  case 0xb4:
    local_238 = local_98;
    Token::Token((Token *)CONCAT26(in_stack_fffffffffffff4b6,
                                   CONCAT24(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0)));
    attributes_16._M_extent._M_extent_value = in_stack_fffffffffffff648._M_extent_value;
    attributes_16._M_ptr = (pointer)in_stack_fffffffffffff640;
    uniqueOrPriority_00.info = (Info *)in_stack_fffffffffffff638;
    uniqueOrPriority_00.kind = (short)in_stack_fffffffffffff630;
    uniqueOrPriority_00._2_1_ = (char)((ulong)in_stack_fffffffffffff630 >> 0x10);
    uniqueOrPriority_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffff630 >> 0x18);
    uniqueOrPriority_00.rawLen = (int)((ulong)in_stack_fffffffffffff630 >> 0x20);
    local_8 = (ForLoopStatementSyntax *)
              parseConditionalStatement
                        (in_stack_fffffffffffff628,in_stack_fffffffffffff620,attributes_16,
                         uniqueOrPriority_00);
    break;
  case 0xec:
  case 0x139:
  case 0x13a:
    local_b8 = ParserBase::peek(in_stack_fffffffffffff4b8,
                                CONCAT22(in_stack_fffffffffffff4b6,in_stack_fffffffffffff4b4));
    DVar16 = SUB84((ulong)in_stack_fffffffffffff520 >> 0x20,0);
    if ((ushort)(local_b8.kind - CaseKeyword) < 3) {
      local_118 = ParserBase::consume(in_stack_fffffffffffff4d0);
      local_f0 = local_118;
      local_108 = local_98;
      local_128 = ParserBase::consume(in_stack_fffffffffffff4d0);
      attributes_23._M_extent._M_extent_value = in_stack_fffffffffffff7f0._M_extent_value;
      attributes_23._M_ptr = in_stack_fffffffffffff7e8;
      uniqueOrPriority_01.info = in_stack_fffffffffffff7e0;
      uniqueOrPriority_01.kind = (short)in_stack_fffffffffffff7d8;
      uniqueOrPriority_01._2_1_ = (char)((ulong)in_stack_fffffffffffff7d8 >> 0x10);
      uniqueOrPriority_01.numFlags.raw = (char)((ulong)in_stack_fffffffffffff7d8 >> 0x18);
      uniqueOrPriority_01.rawLen = (int)((ulong)in_stack_fffffffffffff7d8 >> 0x20);
      caseKeyword.info = in_stack_fffffffffffff808;
      caseKeyword.kind = (short)in_stack_fffffffffffff800;
      caseKeyword._2_1_ = (char)((ulong)in_stack_fffffffffffff800 >> 0x10);
      caseKeyword.numFlags.raw = (char)((ulong)in_stack_fffffffffffff800 >> 0x18);
      caseKeyword.rawLen = (int)((ulong)in_stack_fffffffffffff800 >> 0x20);
      local_8 = (ForLoopStatementSyntax *)
                parseCaseStatement(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,attributes_23
                                   ,uniqueOrPriority_01,caseKeyword);
    }
    else if (local_b8.kind == IfKeyword) {
      local_c8 = local_98;
      local_d8 = ParserBase::consume(in_stack_fffffffffffff4d0);
      attributes_15._M_extent._M_extent_value = in_stack_fffffffffffff648._M_extent_value;
      attributes_15._M_ptr = (pointer)in_stack_fffffffffffff640;
      uniqueOrPriority.info = (Info *)in_stack_fffffffffffff638;
      uniqueOrPriority.kind = (short)in_stack_fffffffffffff630;
      uniqueOrPriority._2_1_ = (char)((ulong)in_stack_fffffffffffff630 >> 0x10);
      uniqueOrPriority.numFlags.raw = (char)((ulong)in_stack_fffffffffffff630 >> 0x18);
      uniqueOrPriority.rawLen = (int)((ulong)in_stack_fffffffffffff630 >> 0x20);
      local_8 = (ForLoopStatementSyntax *)
                parseConditionalStatement
                          (in_stack_fffffffffffff628,in_stack_fffffffffffff620,attributes_15,
                           uniqueOrPriority);
    }
    else {
      local_12c = 0x420005;
      local_148 = ParserBase::peek(in_stack_fffffffffffff4b8,
                                   CONCAT22(in_stack_fffffffffffff4b6,in_stack_fffffffffffff4b4));
      local_138 = Token::location(&local_148);
      ParserBase::addDiag(in_stack_fffffffffffff510,DVar16,in_stack_fffffffffffff518);
      local_168 = ParserBase::peek(&in_stack_fffffffffffff4a8->super_ParserBase);
      local_158 = LexerFacts::getTokenKindText(in_stack_fffffffffffff4b6);
      arg._M_str = (char *)in_stack_fffffffffffff500;
      arg._M_len = in_stack_fffffffffffff4f8;
      Diagnostic::operator<<(in_stack_fffffffffffff4f0,arg);
      std::optional<slang::DiagCode>::optional((optional<slang::DiagCode> *)&local_16e);
      local_174 = local_16a;
      local_178 = local_16e;
      ParserBase::skipToken
                (in_stack_fffffffffffff578,
                 (_Optional_base<slang::DiagCode,_true,_true>)
                 SUB86((ulong)in_stack_fffffffffffff580 >> 0x10,0));
      elements._M_extent._M_extent_value = in_stack_fffffffffffff4c0._M_extent_value;
      elements._M_ptr = (pointer)in_stack_fffffffffffff4b8;
      local_1c8 = local_98;
      slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                 CONCAT26(in_stack_fffffffffffff4b6,
                          CONCAT24(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0)),elements);
      local_1f0 = ParserBase::peek(&in_stack_fffffffffffff4a8->super_ParserBase);
      local_1e0 = Token::location(&local_1f0);
      local_1d8 = ParserBase::missingToken
                            (in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b6,
                             (SourceLocation)in_stack_fffffffffffff4c0._M_extent_value);
      semicolon.info = (Info *)in_stack_fffffffffffff4c0._M_extent_value;
      semicolon._0_8_ = in_stack_fffffffffffff4b8;
      local_8 = (ForLoopStatementSyntax *)
                slang::syntax::SyntaxFactory::emptyStatement
                          ((SyntaxFactory *)
                           CONCAT26(in_stack_fffffffffffff4b6,
                                    CONCAT24(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0)),
                           (NamedLabelSyntax *)in_stack_fffffffffffff4a8,
                           (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)0x6ed9f4,semicolon)
      ;
    }
    break;
  case 0xf9:
    attributes_21._M_extent._M_extent_value = in_stack_fffffffffffff720._M_extent_value;
    attributes_21._M_ptr = in_stack_fffffffffffff718;
    local_458 = local_98;
    local_8 = (ForLoopStatementSyntax *)
              parseRandCaseStatement
                        (in_stack_fffffffffffff710,
                         (NamedLabelSyntax *)in_stack_fffffffffffff708._M_extent_value,attributes_21
                        );
    break;
  case 0xfa:
    attributes_22._M_extent._M_extent_value = in_stack_fffffffffffff7a0._M_extent_value;
    attributes_22._M_ptr = in_stack_fffffffffffff798;
    local_468 = local_98;
    local_8 = (ForLoopStatementSyntax *)
              parseRandSequenceStatement
                        (in_stack_fffffffffffff790,in_stack_fffffffffffff788,attributes_22);
    break;
  case 0x101:
    attributes_05._M_extent._M_extent_value = in_stack_fffffffffffff590._M_extent_value;
    attributes_05._M_ptr = (pointer)in_stack_fffffffffffff588;
    local_3d8 = local_98;
    local_8 = (ForLoopStatementSyntax *)
              parseProceduralDeassignStatement
                        (in_stack_fffffffffffff580,(NamedLabelSyntax *)in_stack_fffffffffffff578,
                         attributes_05,in_stack_fffffffffffff574);
    break;
  case 0x102:
  case 0x14b:
    attributes_09._M_extent._M_extent_value = in_stack_fffffffffffff5d8._M_extent_value;
    attributes_09._M_ptr = in_stack_fffffffffffff5d0;
    local_2f8 = local_98;
    local_8 = (ForLoopStatementSyntax *)
              parseLoopStatement((Parser *)
                                 CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
                                 in_stack_fffffffffffff5c0,attributes_09);
    break;
  case 0x104:
    attributes_02._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffff570;
    attributes_02._M_ptr = (pointer)in_stack_fffffffffffff568;
    attributes_02._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffff574;
    local_338 = local_98;
    local_8 = (ForLoopStatementSyntax *)
              parseReturnStatement
                        (in_stack_fffffffffffff560,in_stack_fffffffffffff558,attributes_02);
    break;
  case 0x144:
    attributes_12._M_extent._M_extent_value = in_stack_fffffffffffff600._M_extent_value;
    attributes_12._M_ptr = (pointer)in_stack_fffffffffffff5f8._M_extent_value;
    local_528 = local_98;
    local_8 = (ForLoopStatementSyntax *)
              parseVoidCallStatement
                        ((Parser *)CONCAT17(in_stack_fffffffffffff5f7,in_stack_fffffffffffff5f0),
                         (NamedLabelSyntax *)in_stack_fffffffffffff5e8,attributes_12);
    break;
  case 0x145:
    attributes_17._M_extent._M_extent_value = in_stack_fffffffffffff650._M_extent_value;
    attributes_17._M_ptr = (pointer)in_stack_fffffffffffff648._M_extent_value;
    local_438 = local_98;
    local_8 = (ForLoopStatementSyntax *)
              parseWaitStatement(in_stack_fffffffffffff640,in_stack_fffffffffffff638,attributes_17);
    break;
  case 0x146:
    attributes_19._M_extent._M_extent_value = in_stack_fffffffffffff6a0._M_extent_value;
    attributes_19._M_ptr = in_stack_fffffffffffff698;
    local_448 = local_98;
    local_8 = (ForLoopStatementSyntax *)
              parseWaitOrderStatement
                        (in_stack_fffffffffffff690,in_stack_fffffffffffff688,attributes_19);
    break;
  case 0x153:
    local_598 = ParserBase::peek(in_stack_fffffffffffff4b8,
                                 CONCAT22(in_stack_fffffffffffff4b6,in_stack_fffffffffffff4b4));
    TVar2.info = local_5b8.info;
    TVar2.kind = local_5b8.kind;
    TVar2._2_1_ = local_5b8._2_1_;
    TVar2.numFlags.raw = local_5b8.numFlags.raw;
    TVar2.rawLen = local_5b8.rawLen;
    TVar15.info = in_stack_fffffffffffff568;
    TVar15.kind = (TokenKind)local_5c8;
    TVar15._2_1_ = local_5c8._2_1_;
    TVar15.numFlags.raw = local_5c8._3_1_;
    TVar15.rawLen = local_5c8._4_4_;
    bVar11 = false;
    if (local_598.kind == DoubleColon) {
      local_5a8 = ParserBase::peek(in_stack_fffffffffffff4b8,
                                   CONCAT22(in_stack_fffffffffffff4b6,in_stack_fffffffffffff4b4));
      TVar2.info = local_5b8.info;
      TVar2.kind = local_5b8.kind;
      TVar2._2_1_ = local_5b8._2_1_;
      TVar2.numFlags.raw = local_5b8.numFlags.raw;
      TVar2.rawLen = local_5b8.rawLen;
      TVar15.info = in_stack_fffffffffffff568;
      TVar15.kind = (TokenKind)local_5c8;
      TVar15._2_1_ = local_5c8._2_1_;
      TVar15.numFlags.raw = local_5c8._3_1_;
      TVar15.rawLen = local_5c8._4_4_;
      bVar11 = false;
      if (local_5a8.kind == Identifier) {
        local_5b8 = ParserBase::peek(in_stack_fffffffffffff4b8,
                                     CONCAT22(in_stack_fffffffffffff4b6,in_stack_fffffffffffff4b4));
        TVar15.info = in_stack_fffffffffffff568;
        TVar15.kind = (TokenKind)local_5c8;
        TVar15._2_1_ = local_5c8._2_1_;
        TVar15.numFlags.raw = local_5c8._3_1_;
        TVar15.rawLen = local_5c8._4_4_;
        bVar11 = false;
        TVar2 = local_5b8;
        if (local_5b8.kind == Identifier) {
          TVar15 = ParserBase::peek(in_stack_fffffffffffff4b8,
                                    CONCAT22(in_stack_fffffffffffff4b6,in_stack_fffffffffffff4b4));
          local_5c0 = TVar15.info;
          local_5c8._0_2_ = TVar15.kind;
          bVar11 = (TokenKind)local_5c8 == OpenParenthesis;
          TVar2 = local_5b8;
        }
      }
    }
    TVar5.info = local_540.info;
    TVar5.kind = local_540.kind;
    TVar5._2_1_ = local_540._2_1_;
    TVar5.numFlags.raw = local_540.numFlags.raw;
    TVar5.rawLen = local_540.rawLen;
    TVar4.info = local_550.info;
    TVar4.kind = local_550.kind;
    TVar4._2_1_ = local_550._2_1_;
    TVar4.numFlags.raw = local_550.numFlags.raw;
    TVar4.rawLen = local_550.rawLen;
    TVar3.info = local_560.info;
    TVar3.kind = local_560.kind;
    TVar3._2_1_ = local_560._2_1_;
    TVar3.numFlags.raw = local_560.numFlags.raw;
    TVar3.rawLen = local_560.rawLen;
    local_5c8 = TVar15._0_8_;
    TVar13.info = local_a8.info;
    TVar13._0_8_ = pNVar9;
    TVar14.info = local_568;
    TVar14._0_8_ = in_stack_fffffffffffff5c0;
    TVar6 = local_5a8;
    TVar7 = local_598;
    if (bVar11) {
      AVar12._M_extent._M_extent_value = in_stack_fffffffffffff530._M_extent_value;
      AVar12._M_ptr = in_stack_fffffffffffff528;
      local_5b8 = TVar2;
      local_5d8 = local_98;
      local_8 = (ForLoopStatementSyntax *)
                parseCheckerStatement
                          (in_stack_fffffffffffff520,(NamedLabelSyntax *)in_stack_fffffffffffff518,
                           AVar12);
      break;
    }
LAB_006eec32:
    DVar16 = SUB84((ulong)in_stack_fffffffffffff520 >> 0x20,0);
    local_5c8 = TVar15._0_8_;
    local_a8.info = TVar13.info;
    local_568 = TVar14.info;
    local_5b8 = TVar2;
    local_5a8 = TVar6;
    local_598 = TVar7;
    local_560 = TVar3;
    local_550 = TVar4;
    local_540 = TVar5;
    local_5e8 = ParserBase::peek(&in_stack_fffffffffffff4a8->super_ParserBase);
    bVar11 = slang::syntax::SyntaxFacts::isPossibleExpression(in_stack_fffffffffffff4b4);
    if (bVar11) {
      bitmask<slang::parsing::detail::ExpressionOptions>::bitmask
                (&local_5ec,ProceduralAssignmentContext);
      if ((bVar8 & 1) != 0) {
        bitmask<slang::parsing::detail::ExpressionOptions>::bitmask(&local_5f0,AllowSuperNewCall);
        bitmask<slang::parsing::detail::ExpressionOptions>::operator|=(&local_5ec,&local_5f0);
      }
      local_5fc = local_5ec.m_bits;
      this_00 = (ParserBase *)parseSubExpression(in_stack_fffffffffffff760,options_00,precedence);
      elements_03._M_extent._M_extent_value = in_stack_fffffffffffff4c0._M_extent_value;
      elements_03._M_ptr = (pointer)in_stack_fffffffffffff4b8;
      pNVar9 = local_28;
      local_5f8 = this_00;
      local_648 = local_98;
      slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                 CONCAT26(in_stack_fffffffffffff4b6,
                          CONCAT24(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0)),elements_03
                );
      local_658 = ParserBase::expect(this_00,(TokenKind)((ulong)pNVar9 >> 0x30));
      semi.info = (Info *)in_stack_fffffffffffff4d0;
      semi.kind = (short)in_stack_fffffffffffff4c8;
      semi._2_1_ = (char)((ulong)in_stack_fffffffffffff4c8 >> 0x10);
      semi.numFlags.raw = (char)((ulong)in_stack_fffffffffffff4c8 >> 0x18);
      semi.rawLen = (int)((ulong)in_stack_fffffffffffff4c8 >> 0x20);
      local_8 = (ForLoopStatementSyntax *)
                slang::syntax::SyntaxFactory::expressionStatement
                          ((SyntaxFactory *)in_stack_fffffffffffff4c0._M_extent_value,
                           (NamedLabelSyntax *)in_stack_fffffffffffff4b8,
                           (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                           CONCAT26(in_stack_fffffffffffff4b6,
                                    CONCAT24(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0)),
                           (ExpressionSyntax *)in_stack_fffffffffffff4a8,semi);
    }
    else {
      local_65c = 0x510005;
      local_678 = ParserBase::peek(&in_stack_fffffffffffff4a8->super_ParserBase);
      local_668 = Token::location(&local_678);
      ParserBase::addDiag(in_stack_fffffffffffff510,DVar16,in_stack_fffffffffffff518);
      elements_04._M_extent._M_extent_value = in_stack_fffffffffffff4c0._M_extent_value;
      elements_04._M_ptr = (pointer)in_stack_fffffffffffff4b8;
      local_6c8 = local_98;
      slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                 CONCAT26(in_stack_fffffffffffff4b6,
                          CONCAT24(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0)),elements_04
                );
      local_6f0 = ParserBase::peek(&in_stack_fffffffffffff4a8->super_ParserBase);
      local_6e0 = Token::location(&local_6f0);
      local_6d8 = ParserBase::missingToken
                            (in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b6,
                             (SourceLocation)in_stack_fffffffffffff4c0._M_extent_value);
      semicolon_01.info = local_6d8.info;
      semicolon_01._0_8_ = in_stack_fffffffffffff4b8;
      local_8 = (ForLoopStatementSyntax *)
                slang::syntax::SyntaxFactory::emptyStatement
                          ((SyntaxFactory *)
                           CONCAT26(in_stack_fffffffffffff4b6,
                                    CONCAT24(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0)),
                           (NamedLabelSyntax *)in_stack_fffffffffffff4a8,
                           (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)0x6eef95,
                           semicolon_01);
    }
  }
  local_dc = 1;
  DepthGuard::~DepthGuard((DepthGuard *)&stack0xffffffffffffffe0);
  return &local_8->super_StatementSyntax;
}

Assistant:

StatementSyntax& Parser::parseStatement(bool allowEmpty, bool allowSuperNew) {
    auto dg = setDepthGuard();

    NamedLabelSyntax* label = nullptr;
    if (peek().kind == TokenKind::Identifier && peek(1).kind == TokenKind::Colon) {
        auto name = consume();
        label = &factory.namedLabel(name, consume());
    }

    auto attributes = parseAttributes();
    switch (peek().kind) {
        case TokenKind::UniqueKeyword:
        case TokenKind::Unique0Keyword:
        case TokenKind::PriorityKeyword: {
            switch (peek(1).kind) {
                case TokenKind::IfKeyword:
                    return parseConditionalStatement(label, attributes, consume());
                case TokenKind::CaseKeyword:
                case TokenKind::CaseXKeyword:
                case TokenKind::CaseZKeyword: {
                    auto modifier = consume();
                    return parseCaseStatement(label, attributes, modifier, consume());
                }
                default: {
                    addDiag(diag::ExpectedIfOrCase, peek(1).location())
                        << LexerFacts::getTokenKindText(peek().kind);
                    skipToken(std::nullopt);
                    return factory.emptyStatement(
                        label, attributes, missingToken(TokenKind::Semicolon, peek().location()));
                }
            }
        }
        case TokenKind::CaseKeyword:
        case TokenKind::CaseXKeyword:
        case TokenKind::CaseZKeyword:
            return parseCaseStatement(label, attributes, Token(), consume());
        case TokenKind::IfKeyword:
            return parseConditionalStatement(label, attributes, Token());
        case TokenKind::ForeverKeyword: {
            auto forever = consume();
            auto& body = parseStatement();
            checkEmptyBody(body, forever, "forever loop"sv);
            return factory.foreverStatement(label, attributes, forever, body);
        }
        case TokenKind::RepeatKeyword:
        case TokenKind::WhileKeyword:
            return parseLoopStatement(label, attributes);
        case TokenKind::DoKeyword:
            return parseDoWhileStatement(label, attributes);
        case TokenKind::ForKeyword:
            return parseForLoopStatement(label, attributes);
        case TokenKind::ForeachKeyword:
            return parseForeachLoopStatement(label, attributes);
        case TokenKind::ReturnKeyword:
            return parseReturnStatement(label, attributes);
        case TokenKind::BreakKeyword:
        case TokenKind::ContinueKeyword:
            return parseJumpStatement(label, attributes);
        case TokenKind::Hash:
        case TokenKind::DoubleHash:
        case TokenKind::At: {
            auto timingControl = parseTimingControl();
            SLANG_ASSERT(timingControl);
            return factory.timingControlStatement(label, attributes, *timingControl,
                                                  parseStatement());
        }
        case TokenKind::AssignKeyword:
            return parseProceduralAssignStatement(label, attributes,
                                                  SyntaxKind::ProceduralAssignStatement);
        case TokenKind::ForceKeyword:
            return parseProceduralAssignStatement(label, attributes,
                                                  SyntaxKind::ProceduralForceStatement);
        case TokenKind::DeassignKeyword:
            return parseProceduralDeassignStatement(label, attributes,
                                                    SyntaxKind::ProceduralDeassignStatement);
        case TokenKind::ReleaseKeyword:
            return parseProceduralDeassignStatement(label, attributes,
                                                    SyntaxKind::ProceduralReleaseStatement);
        case TokenKind::DisableKeyword:
            return parseDisableStatement(label, attributes);
        case TokenKind::BeginKeyword:
            return parseBlock(SyntaxKind::SequentialBlockStatement, TokenKind::EndKeyword, label,
                              attributes);
        case TokenKind::ForkKeyword:
            return parseBlock(SyntaxKind::ParallelBlockStatement, TokenKind::JoinKeyword, label,
                              attributes);
        case TokenKind::AssertKeyword:
        case TokenKind::AssumeKeyword:
        case TokenKind::CoverKeyword:
            return parseAssertionStatement(label, attributes);
        case TokenKind::RestrictKeyword:
        case TokenKind::ExpectKeyword:
            return parseConcurrentAssertion(label, attributes);
        case TokenKind::WaitKeyword:
            return parseWaitStatement(label, attributes);
        case TokenKind::WaitOrderKeyword:
            return parseWaitOrderStatement(label, attributes);
        case TokenKind::RandCaseKeyword:
            return parseRandCaseStatement(label, attributes);
        case TokenKind::RandSequenceKeyword:
            return parseRandSequenceStatement(label, attributes);
        case TokenKind::Semicolon:
            if (label)
                addDiag(diag::NoLabelOnSemicolon, peek().location());
            else if (!allowEmpty)
                addDiag(diag::ExpectedStatement, peek().location());
            return factory.emptyStatement(label, attributes, consume());
        case TokenKind::MinusArrow:
        case TokenKind::MinusDoubleArrow:
            return parseEventTriggerStatement(label, attributes);
        case TokenKind::VoidKeyword:
            return parseVoidCallStatement(label, attributes);
        case TokenKind::Identifier: {
            // This could be a checker instantiation.
            uint32_t index = 1;
            if (peek(index).kind == TokenKind::DoubleColon &&
                peek(index + 1).kind == TokenKind::Identifier) {
                index = 3;
            }

            if (peek(index).kind == TokenKind::Identifier &&
                peek(index + 1).kind == TokenKind::OpenParenthesis) {
                return parseCheckerStatement(label, attributes);
            }

            break;
        }
        case TokenKind::UnitSystemName:
            if (peek(1).kind == TokenKind::DoubleColon && peek(2).kind == TokenKind::Identifier &&
                peek(3).kind == TokenKind::Identifier &&
                peek(4).kind == TokenKind::OpenParenthesis) {
                return parseCheckerStatement(label, attributes);
            }
            break;
        default:
            break;
    }

    // everything else should be some kind of expression
    if (isPossibleExpression(peek().kind)) {
        bitmask<ExpressionOptions> options = ExpressionOptions::ProceduralAssignmentContext;
        if (allowSuperNew)
            options |= ExpressionOptions::AllowSuperNewCall;

        auto& expr = parseSubExpression(options, 0);
        return factory.expressionStatement(label, attributes, expr, expect(TokenKind::Semicolon));
    }

    addDiag(diag::ExpectedStatement, peek().location());
    return factory.emptyStatement(label, attributes,
                                  missingToken(TokenKind::Semicolon, peek().location()));
}